

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ServerSegment.cpp
# Opt level: O3

byte * __thiscall ServerSegment::prepareSegment(ServerSegment *this)

{
  uint uVar1;
  byte *pbVar2;
  
  pbVar2 = (byte *)calloc(0x5c0,1);
  *(undefined8 *)pbVar2 = *(undefined8 *)this;
  pbVar2[8] = this->ackFlag;
  pbVar2[9] = this->finFlag;
  uVar1._0_2_ = this->length;
  uVar1._2_2_ = this->checksum;
  *(uint *)(pbVar2 + 10) = uVar1;
  *(byte2 *)(pbVar2 + 0xe) = this->reserved;
  memcpy(pbVar2 + 0x10,this->data,(ulong)(uVar1 & 0xffff));
  return pbVar2;
}

Assistant:

byte *ServerSegment::prepareSegment() {

    int counter = 0;
    byte *buffer = (byte *) calloc(MTU, sizeof(byte));

    memset(buffer, 0, MTU);

    memcpy(buffer + counter, &sequenceNumber, sizeof(sequenceNumber));
    counter += sizeof(sequenceNumber);

    memcpy(buffer + counter, &ackNumber, sizeof(ackNumber));
    counter += sizeof(ackNumber);

    memcpy(buffer + counter, &ackFlag, 1);
    counter += sizeof(ackFlag);

    memcpy(buffer + counter, &finFlag, 1);
    counter += sizeof(finFlag);

    memcpy(buffer + counter, &length, sizeof(length));
    counter += sizeof(length);

    memcpy(buffer + counter, &checksum, sizeof(checksum));
    counter += sizeof(checksum);

    memcpy(buffer + counter, &reserved, sizeof(reserved));
    counter += sizeof(reserved);

    memcpy(buffer + counter, data, length);

    return buffer;
}